

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

uint AttributeVersions(Node *node,AttVal *attval)

{
  TidyAttrId TVar1;
  AttrVersion *pAVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar6 = 0;
  if (attval != (AttVal *)0x0) {
    if ((attval->attribute != (ctmbstr)0x0) &&
       (iVar4 = prvTidytmbstrncmp(attval->attribute,"data-",5), iVar4 == 0)) {
      return 0x60000;
    }
    uVar6 = 0;
    if ((((attval->dict != (Attribute *)0x0) && (uVar6 = 0xe000, node != (Node *)0x0)) &&
        (node->tag != (Dict *)0x0)) &&
       ((pAVar2 = node->tag->attrvers, pAVar2 != (AttrVersion *)0x0 &&
        (pAVar2->attribute != TidyAttr_UNKNOWN)))) {
      TVar1 = attval->dict->id;
      if (pAVar2->attribute == TVar1) {
        uVar5 = 0;
      }
      else {
        uVar3 = 1;
        do {
          uVar5 = uVar3;
          if (pAVar2[uVar5].attribute == TidyAttr_UNKNOWN) {
            return 0xe000;
          }
          uVar3 = (ulong)((int)uVar5 + 1);
        } while (pAVar2[uVar5].attribute != TVar1);
      }
      uVar6 = pAVar2[uVar5].versions;
    }
  }
  return uVar6;
}

Assistant:

static uint AttributeVersions(Node* node, AttVal* attval)
{
    uint i;

    /* Override or add to items in attrdict.c */
    if (attval && attval->attribute) {
        /* HTML5 data-* attributes can't be added generically; handle here. */
        if (TY_(tmbstrncmp)(attval->attribute, "data-", 5) == 0)
            return (XH50 | HT50);
    }
    /* TODO: maybe this should return VERS_PROPRIETARY instead? */
    if (!attval || !attval->dict)
        return VERS_UNKNOWN;

    if (!(!node || !node->tag || !node->tag->attrvers))
        for (i = 0; node->tag->attrvers[i].attribute; ++i)
            if (node->tag->attrvers[i].attribute == attval->dict->id)
                return node->tag->attrvers[i].versions;

    return VERS_PROPRIETARY;
}